

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O1

void my_numbox_set(t_my_numbox *x,t_floatarg f)

{
  t_float ftocompare;
  
  if (f != x->x_val) {
    x->x_val = f;
    if (pd_compatibilitylevel < 0x35) {
      if ((double)f < x->x_min) {
        x->x_val = (float)x->x_min;
      }
      if (x->x_max < (double)x->x_val) {
        x->x_val = (float)x->x_max;
      }
    }
    sys_queuegui(x,(x->x_gui).x_glist,my_numbox_draw_update);
    return;
  }
  return;
}

Assistant:

static void my_numbox_set(t_my_numbox *x, t_floatarg f)
{
    t_float ftocompare = f;
        /* bitwise comparison, suggested by Dan Borstein - to make this work
        ftocompare must be t_float type like x_val. */
    if (memcmp(&ftocompare, &x->x_val, sizeof(ftocompare)))
    {
        x->x_val = ftocompare;
        if (pd_compatibilitylevel < 53)
            my_numbox_clip(x);
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
}